

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O3

void Extra_StringClean(char *pStrGiven,char *pCharKeep)

{
  char cVar1;
  char *pTemp;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  
  cVar1 = *pStrGiven;
  pcVar2 = pStrGiven;
  if (cVar1 != '\0') {
    do {
      cVar4 = *pCharKeep;
      pcVar3 = pCharKeep + 1;
      while (cVar4 != '\0') {
        if (cVar1 == cVar4) {
          *pcVar2 = cVar1;
          pcVar2 = pcVar2 + 1;
          break;
        }
        cVar4 = *pcVar3;
        pcVar3 = pcVar3 + 1;
      }
      cVar1 = pStrGiven[1];
      pStrGiven = pStrGiven + 1;
    } while (cVar1 != '\0');
  }
  *pcVar2 = '\0';
  return;
}

Assistant:

void Extra_StringClean( char * pStrGiven, char * pCharKeep )
{
    char * pTemp, * pChar, * pSave = pStrGiven;
    for ( pTemp = pStrGiven; *pTemp; pTemp++ )
    {
        for ( pChar = pCharKeep; *pChar; pChar++ )
            if ( *pTemp == *pChar )
                break;
        if ( *pChar == 0 )
            continue;
        *pSave++ = *pTemp;
    }
    *pSave = 0;
}